

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O2

void __thiscall
layer::Convolution2D::majWeight(Convolution2D *this,scalar learningRate,scalar add,scalar multi)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  tensor ppplVar10;
  tensor ppplVar11;
  tensor *pppplVar12;
  longdouble *plVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  
  uVar1 = (this->super_Layer)._sizeYOut;
  uVar2 = (this->super_Layer)._sizeZOut;
  uVar14 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar14 = 0;
  }
  uVar15 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar15 = 0;
  }
  for (uVar20 = 0; uVar20 != uVar15; uVar20 = uVar20 + 1) {
    uVar1 = (this->super_Layer)._sizeXOut;
    if ((int)uVar1 < 1) {
      uVar1 = 0;
    }
    for (uVar17 = 0; uVar17 != uVar14; uVar17 = uVar17 + 1) {
      uVar2 = (this->super_Layer)._sizeZWeight;
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      for (uVar21 = 0; uVar21 != uVar1; uVar21 = uVar21 + 1) {
        iVar3 = this->_stepY;
        iVar4 = this->_zeroPaddingY;
        uVar5 = (this->super_Layer)._sizeYWeight;
        if ((int)uVar5 < 1) {
          uVar5 = 0;
        }
        for (uVar23 = 0; uVar23 != uVar2; uVar23 = uVar23 + 1) {
          iVar6 = this->_stepX;
          iVar7 = this->_zeroPaddingX;
          uVar8 = (this->super_Layer)._sizeXWeight;
          if ((int)uVar8 < 1) {
            uVar8 = 0;
          }
          iVar9 = this->_sizeYIn;
          uVar18 = iVar3 * (int)uVar17 - iVar4;
          for (uVar16 = 0; uVar16 != uVar5; uVar16 = uVar16 + 1) {
            if ((int)uVar18 < iVar9 && -1 < (int)uVar18) {
              ppplVar10 = (this->super_Layer)._in;
              ppplVar11 = (this->super_Layer)._delta;
              pppplVar12 = (this->super_Layer)._ptrWeight;
              uVar22 = iVar6 * (int)uVar21 - iVar7;
              for (lVar19 = 0; (ulong)uVar8 * 0x10 != lVar19; lVar19 = lVar19 + 0x10) {
                if ((int)uVar22 < iVar9 && -1 < (int)uVar22) {
                  plVar13 = pppplVar12[uVar20][uVar23][uVar16];
                  *(longdouble *)((long)plVar13 + lVar19) =
                       *(longdouble *)((long)plVar13 + lVar19) +
                       ppplVar10[uVar23][uVar18][uVar22] *
                       ppplVar11[uVar20][uVar17][uVar21] * learningRate._0_10_ * multi._0_10_ +
                       add._0_10_;
                }
                uVar22 = uVar22 + 1;
              }
            }
            uVar18 = uVar18 + 1;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void Convolution2D::majWeight(type::scalar learningRate, type::scalar add, type::scalar multi)
    {

        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] +=
                                                (learningRate * _delta[posZOut][posYOut][posXOut] *
                                                 _in[posZKernel][posYIn][posXIn] * multi) + add;
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                }
            }
        }

    }